

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

bool IntToMinMaxCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  ulong *puVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  int32_t *dataptr;
  void *pvVar11;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t iVar12;
  idx_t extraout_RDX_03;
  idx_t idx;
  idx_t extraout_RDX_04;
  idx_t extraout_RDX_05;
  idx_t iVar13;
  VectorType VVar14;
  idx_t idx_in_entry;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int32_t max_val;
  int32_t min_val;
  int32_t *local_c8;
  int32_t *local_c0;
  long local_b8;
  void *local_b0;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  Vector *local_98;
  void *local_90;
  unsigned_long local_88;
  int32_t local_80;
  int32_t local_7c;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_7c = MinMaxType::GetMinValue((LogicalType *)(result + 8));
  local_80 = MinMaxType::GetMaxValue((LogicalType *)(result + 8));
  dataptr = &local_80;
  VVar14 = (VectorType)result;
  local_c8 = &local_7c;
  local_c0 = dataptr;
  if (*source == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar14);
    lVar5 = *(long *)(result + 0x20);
    lVar6 = *(long *)(source + 0x20);
    duckdb::FlatVector::VerifyFlatVector(source);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (*(long *)(source + 0x28) == 0) {
      if (count != 0) {
        iVar13 = 0;
        iVar12 = extraout_RDX;
        do {
          iVar2 = *(int *)(lVar6 + iVar13 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar2,(ValidityMask *)&local_c8,iVar12,dataptr);
          *(int *)(lVar5 + iVar13 * 4) = iVar2;
          iVar13 = iVar13 + 1;
          iVar12 = extraout_RDX_04;
        } while (count != iVar13);
      }
    }
    else {
      *(long *)(result + 0x28) = *(long *)(source + 0x28);
      duckdb::shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30),
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(source + 0x30));
      *(undefined8 *)(result + 0x40) = *(undefined8 *)(source + 0x40);
      if (0x3f < count + 0x3f) {
        local_b0 = (void *)(count + 0x3f >> 6);
        pvVar11 = (void *)0x0;
        iVar12 = extraout_RDX_00;
        uVar16 = 0;
        local_b8 = lVar5;
        local_98 = source;
        do {
          lVar5 = local_b8;
          if (*(long *)(source + 0x28) == 0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = *(ulong *)(*(long *)(source + 0x28) + (long)pvVar11 * 8);
          }
          uVar17 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar17 = count;
          }
          uVar18 = uVar17;
          local_90 = pvVar11;
          if (uVar15 != 0) {
            uVar18 = uVar16;
            if (uVar15 == 0xffffffffffffffff) {
              if (uVar16 < uVar17) {
                do {
                  iVar2 = *(int *)(lVar6 + uVar18 * 4);
                  duckdb::UnaryLambdaWrapper::
                  Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                            (iVar2,(ValidityMask *)&local_c8,iVar12,pvVar11);
                  *(int *)(lVar5 + uVar18 * 4) = iVar2;
                  uVar18 = uVar18 + 1;
                  iVar12 = extraout_RDX_01;
                } while (uVar17 != uVar18);
              }
            }
            else if (uVar16 < uVar17) {
              lVar5 = local_b8 + uVar16 * 4;
              uVar18 = 0;
              do {
                if ((uVar15 >> (uVar18 & 0x3f) & 1) != 0) {
                  iVar2 = *(int *)(lVar6 + uVar16 * 4 + uVar18 * 4);
                  duckdb::UnaryLambdaWrapper::
                  Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                            (iVar2,(ValidityMask *)&local_c8,iVar12,pvVar11);
                  *(int *)(lVar5 + uVar18 * 4) = iVar2;
                  iVar12 = extraout_RDX_02;
                }
                uVar18 = uVar18 + 1;
              } while ((uVar16 - uVar17) + uVar18 != 0);
              source = local_98;
              uVar18 = uVar16 + uVar18;
            }
          }
          pvVar11 = (void *)((long)local_90 + 1);
          uVar16 = uVar18;
        } while (pvVar11 != local_b0);
      }
    }
  }
  else if (*source == (Vector)0x2) {
    duckdb::Vector::SetVectorType(VVar14);
    piVar3 = *(int **)(result + 0x20);
    piVar4 = *(int **)(source + 0x20);
    if ((*(byte **)(source + 0x28) == (byte *)0x0) || ((**(byte **)(source + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      iVar2 = *piVar4;
      duckdb::UnaryLambdaWrapper::
      Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                (iVar2,(ValidityMask *)&local_c8,idx,dataptr);
      *piVar3 = iVar2;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)source,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar14);
    lVar5 = *(long *)(result + 0x20);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      if (count != 0) {
        lVar6 = *local_78;
        uVar16 = 0;
        iVar12 = extraout_RDX_03;
        do {
          uVar15 = uVar16;
          if (lVar6 != 0) {
            uVar15 = (ulong)*(uint *)(lVar6 + uVar16 * 4);
          }
          iVar2 = *(int *)(local_70 + uVar15 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar2,(ValidityMask *)&local_c8,iVar12,dataptr);
          *(int *)(lVar5 + uVar16 * 4) = iVar2;
          uVar16 = uVar16 + 1;
          iVar12 = extraout_RDX_05;
        } while (count != uVar16);
      }
    }
    else if (count != 0) {
      lVar6 = *local_78;
      uVar16 = 0;
      do {
        uVar15 = uVar16;
        if (lVar6 != 0) {
          uVar15 = (ulong)*(uint *)(lVar6 + uVar16 * 4);
        }
        pvVar11 = *(void **)(local_68 + (uVar15 >> 6) * 8);
        if (((ulong)pvVar11 >> (uVar15 & 0x3f) & 1) == 0) {
          if (*(long *)(result + 0x28) == 0) {
            local_88 = *(unsigned_long *)(result + 0x40);
            duckdb::make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_88);
            p_Var9 = p_Stack_a0;
            uVar8 = local_a8;
            local_a8 = 0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = uVar8;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var9;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar10 = duckdb::shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                      operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (result + 0x30));
            *(unsigned_long **)(result + 0x28) =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          bVar7 = (byte)uVar16 & 0x3f;
          puVar1 = (ulong *)(*(long *)(result + 0x28) + (uVar16 >> 6) * 8);
          *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        else {
          iVar2 = *(int *)(local_70 + uVar15 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar2,(ValidityMask *)&local_c8,uVar15 >> 6,pvVar11);
          *(int *)(lVar5 + uVar16 * 4) = iVar2;
        }
        uVar16 = uVar16 + 1;
      } while (count != uVar16);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return true;
}

Assistant:

static bool IntToMinMaxCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &ty = result.GetType();
	auto min_val = MinMaxType::GetMinValue(ty);
	auto max_val = MinMaxType::GetMaxValue(ty);
	UnaryExecutor::Execute<int32_t, int32_t>(source, result, count, [&](int32_t input) {
		if (input < min_val || input > max_val) {
			throw ConversionException(StringUtil::Format("Value %s is outside of range [%s,%s]", to_string(input),
			                                             to_string(min_val), to_string(max_val)));
		}
		return input;
	});
	return true;
}